

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O2

complex<float> cdotu(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  complex<float> in_RAX;
  complex<float> cVar1;
  complex<float> *__y;
  ulong uVar2;
  complex<float> *__x;
  bool bVar3;
  
  if (0 < n) {
    cVar1._M_value = (_ComplexT_conflict)(incx ^ 1U);
    if (incy == 1 && (incx ^ 1U) == 0) {
      uVar2 = (ulong)(uint)n;
      while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
        cVar1 = std::operator*(cx,cy);
        cy = cy + 1;
        cx = cx + 1;
      }
    }
    else {
      cVar1._M_value = (_ComplexT_conflict)(incy >> 0x1f & (1 - n) * incy);
      __x = cx + (incx >> 0x1f & (1 - n) * incx);
      __y = cy + cVar1._M_value;
      while (bVar3 = n != 0, n = n + -1, bVar3) {
        cVar1 = std::operator*(__x,__y);
        __x = __x + incx;
        __y = __y + incy;
      }
    }
    return (complex<float>)cVar1._M_value;
  }
  return (complex<float>)in_RAX._M_value;
}

Assistant:

complex <float> cdotu ( int n, complex <float> cx[], int incx,
  complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CDOTU forms the unconjugated dot product of two vectors.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <float> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <float> CDOTU, the unconjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <float> value;

  value = complex <float> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + cx[i] * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + cx[ix] * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}